

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op)

{
  bool forwarding;
  char (*in_R9) [2];
  string local_78;
  char *local_58;
  string local_50;
  
  local_58 = op;
  forwarding = should_forward(this,op0);
  to_unpacked_expression_abi_cxx11_(&local_50,this,op0,true);
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
            (&local_78,(spirv_cross *)&local_58,(char **)0x35c56f,(char (*) [2])&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,in_R9);
  emit_op(this,result_type,result_id,&local_78,forwarding,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  return;
}

Assistant:

void CompilerGLSL::emit_unary_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op)
{
	bool forward = should_forward(op0);
	emit_op(result_type, result_id, join(op, "(", to_unpacked_expression(op0), ")"), forward);
	inherit_expression_dependencies(result_id, op0);
}